

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::OptionInterpreter
          (OptionInterpreter *this,DescriptorBuilder *builder)

{
  LogMessage *other;
  undefined8 in_RSI;
  LogMessage *in_RDI;
  char *in_stack_ffffffffffffff78;
  LogMessage *this_00;
  LogLevel_conflict level;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar1;
  
  *(undefined8 *)in_RDI = in_RSI;
  this_00 = (LogMessage *)&in_RDI->message_;
  std::
  map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)0x4c21f7);
  level = (LogLevel_conflict)((ulong)&in_RDI[1].line_ >> 0x20);
  std::
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::map((map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
         *)0x4c220a);
  DynamicMessageFactory::DynamicMessageFactory
            ((DynamicMessageFactory *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0))
  ;
  bVar1 = 0;
  if (*(long *)in_RDI == 0) {
    internal::LogMessage::LogMessage
              (in_RDI,level,(char *)this_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = 1;
    other = internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff78);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
  }
  if ((bVar1 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4c2292);
  }
  return;
}

Assistant:

DescriptorBuilder::OptionInterpreter::OptionInterpreter(
    DescriptorBuilder* builder)
    : builder_(builder) {
  GOOGLE_CHECK(builder_);
}